

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcSim.c
# Opt level: O1

void Wlc_NtkSimulatePrint(Wlc_Ntk_t *p,Vec_Int_t *vNodes,Vec_Ptr_t *vRes,int nWords,int nFrames)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  
  if (0 < nFrames) {
    iVar6 = 0;
    uVar5 = 0;
    do {
      if (0 < nWords) {
        iVar3 = 0;
        do {
          uVar2 = uVar5 + 0x3f;
          uVar1 = uVar5;
          do {
            if (0 < vNodes->nSize) {
              lVar7 = 0;
              do {
                lVar4 = (long)vNodes->pArray[lVar7];
                if ((lVar4 < 1) || (p->nObjsAlloc <= vNodes->pArray[lVar7])) {
                  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                                ,0x9d,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
                }
                iVar9 = p->pObjs[lVar4].End - p->pObjs[lVar4].Beg;
                uVar5 = iVar9 + 1;
                if (0 < (int)uVar5) {
                  uVar8 = (ulong)uVar5;
                  iVar9 = iVar9 + 2;
                  do {
                    uVar8 = uVar8 - 1;
                    if (vRes->nSize <= lVar7) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                                    ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
                    }
                    iVar9 = iVar9 + -1;
                    if (*(int *)((long)vRes->pArray[lVar7] + 4) < iVar9) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    printf("%d",(ulong)((*(uint *)(*(long *)(*(long *)((long)vRes->pArray[lVar7] + 8
                                                                      ) + (uVar8 & 0xffffffff) * 8)
                                                  + (long)((int)uVar1 >> 5) * 4) >> (uVar1 & 0x1f) &
                                        1) != 0));
                  } while (1 < iVar9);
                }
                putchar(0x20);
                lVar7 = lVar7 + 1;
              } while (lVar7 < vNodes->nSize);
            }
            uVar5 = uVar1 + 1;
            putchar(10);
            bVar10 = uVar1 != uVar2;
            uVar1 = uVar5;
          } while (bVar10);
          iVar3 = iVar3 + 1;
        } while (iVar3 != nWords);
      }
      iVar6 = iVar6 + 1;
      putchar(10);
    } while (iVar6 != nFrames);
  }
  return;
}

Assistant:

void Wlc_NtkSimulatePrint( Wlc_Ntk_t * p, Vec_Int_t * vNodes, Vec_Ptr_t * vRes, int nWords, int nFrames )
{
    Wlc_Obj_t * pWlcObj; 
    int f, w, b, i, k, iPat = 0;
    for ( f = 0; f < nFrames; f++, printf("\n") )
      for ( w = 0; w < nWords; w++ )
        for ( b = 0; b < 64; b++, iPat++, printf("\n") )
        {
            Wlc_NtkForEachObjVec( vNodes, p, pWlcObj, i )
            {
                int nBits = Wlc_ObjRange(pWlcObj);
                for ( k = nBits-1; k >= 0; k-- )
                {
                    word * pInfo = (word*)Vec_VecEntryEntry( (Vec_Vec_t *)vRes, i, k );
                    printf( "%d", Abc_InfoHasBit((unsigned *)pInfo, iPat) );
                }
                printf( " " );
            }
        }
}